

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

void __thiscall
gl4cts::SimpleQueriesTestCase::testSipmleQueries
          (SimpleQueriesTestCase *this,Functions *gl,GLint pname)

{
  bool bVar1;
  GLenum GVar2;
  ostream *poVar3;
  TestError *this_00;
  GLboolean value_bool;
  GLfloat value_float;
  GLint value_int;
  GLdouble value_double;
  GLint64 value_int64;
  char *local_1c0;
  stringstream log;
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&log);
  poVar3 = std::operator<<(&local_190,"Testing simple query for pname: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pname);
  std::operator<<(poVar3," - ");
  (*gl->getIntegerv)(pname,&value_int);
  GVar2 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyError(&log,"getIntegerv",GVar2,0);
  if (bVar1) {
    (*gl->getInteger64v)(pname,&value_int64);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError(&log,"getInteger64v",GVar2,0);
    if (bVar1) {
      (*gl->getFloatv)(pname,&value_float);
      GVar2 = (*gl->getError)();
      bVar1 = SparseTextureUtils::verifyError(&log,"getFloatv",GVar2,0);
      if (bVar1) {
        (*gl->getDoublev)(pname,&value_double);
        GVar2 = (*gl->getError)();
        bVar1 = SparseTextureUtils::verifyError(&log,"getDoublev",GVar2,0);
        if (bVar1) {
          (*gl->getBooleanv)(pname,&value_bool);
          GVar2 = (*gl->getError)();
          bVar1 = SparseTextureUtils::verifyError(&log,"getBooleanv",GVar2,0);
          if (bVar1) {
            std::__cxx11::stringstream::~stringstream((stringstream *)&log);
            return;
          }
        }
      }
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  tcu::TestError::TestError
            (this_00,local_1c0,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
             ,0x3ed);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SimpleQueriesTestCase::testSipmleQueries(const Functions& gl, GLint pname)
{
	std::stringstream log;
	log << "Testing simple query for pname: " << pname << " - ";

	bool result = true;

	GLint	 value_int;
	GLint64   value_int64;
	GLfloat   value_float;
	GLdouble  value_double;
	GLboolean value_bool;

	gl.getIntegerv(pname, &value_int);
	result = SparseTextureUtils::verifyError(log, "getIntegerv", gl.getError(), GL_NO_ERROR);

	if (result)
	{
		gl.getInteger64v(pname, &value_int64);
		result = SparseTextureUtils::verifyError(log, "getInteger64v", gl.getError(), GL_NO_ERROR);

		if (result)
		{
			gl.getFloatv(pname, &value_float);
			result = SparseTextureUtils::verifyError(log, "getFloatv", gl.getError(), GL_NO_ERROR);

			if (result)
			{
				gl.getDoublev(pname, &value_double);
				result = SparseTextureUtils::verifyError(log, "getDoublev", gl.getError(), GL_NO_ERROR);

				if (result)
				{
					gl.getBooleanv(pname, &value_bool);
					result = SparseTextureUtils::verifyError(log, "getBooleanv", gl.getError(), GL_NO_ERROR);
				}
			}
		}
	}

	if (!result)
	{
		TCU_FAIL(log.str().c_str());
	}
}